

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O3

int loader_load_from_configuration(char *path,void **handle,void *allocator)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  configuration config;
  value v;
  value v_00;
  loader_path *paths;
  value v_01;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  value *ppvVar7;
  char *right_path;
  loader_path *canonical;
  loader_name config_name;
  loader_path context_path_str;
  loader_path path_base;
  loader_path join_path;
  size_t local_3168;
  char local_3138 [256];
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  iVar1 = loader_initialize();
  if (iVar1 == 0) {
    sVar2 = strnlen(path,0x1000);
    sVar3 = portability_path_get_name(path,sVar2 + 1,local_3138,0xff);
    if (sVar3 == 0) {
      pcVar4 = "Loader load from configuration invalid config name (%s)";
      sVar3 = 0x19a;
    }
    else {
      config = configuration_create(local_3138,path,(char *)0x0,allocator);
      if (config != (configuration)0x0) {
        v = configuration_value_type(config,"language_id",7);
        if (v == (value)0x0) {
          pcVar4 = "Loader load from configuration invalid tag (%s)";
          sVar3 = 0x1ac;
        }
        else {
          v_00 = configuration_value_type(config,"scripts",9);
          if (v_00 == (value)0x0) {
            pcVar4 = "Loader load from configuration invalid scripts (%s)";
            sVar3 = 0x1b7;
          }
          else {
            sVar3 = value_type_count(v_00);
            if (sVar3 == 0) {
              pcVar4 = "Loader load from configuration cannot load zero scripts";
              sVar3 = 0x1c2;
            }
            else {
              paths = (loader_path *)malloc(sVar3 << 0xc);
              if (paths != (loader_path *)0x0) {
                v_01 = configuration_value_type(config,"path",7);
                if (v_01 == (value)0x0) {
                  local_3168 = 0;
                }
                else {
                  pcVar4 = value_to_string(v_01);
                  sVar5 = value_type_size(v_01);
                  iVar1 = portability_path_is_absolute(pcVar4,sVar5);
                  if (iVar1 != 0) {
                    sVar2 = strnlen(path,0x1000);
                    sVar6 = portability_path_get_directory(path,sVar2 + 1,local_2038,0x1000);
                    sVar5 = portability_path_join(local_2038,sVar6,pcVar4,sVar5,local_1038,0x1000);
                    pcVar4 = local_1038;
                  }
                  local_3168 = portability_path_canonical(pcVar4,sVar5,local_3038,0x1000);
                }
                ppvVar7 = value_to_array(v_00);
                sVar5 = 0;
                canonical = paths;
                do {
                  if (ppvVar7[sVar5] != (value)0x0) {
                    right_path = value_to_string(ppvVar7[sVar5]);
                    sVar6 = value_type_size(ppvVar7[sVar5]);
                    pcVar4 = right_path;
                    if (v_01 != (value)0x0) {
                      pcVar4 = local_2038;
                      sVar6 = portability_path_join
                                        (local_3038,local_3168,right_path,sVar6,pcVar4,0x1000);
                    }
                    portability_path_canonical(pcVar4,sVar6,*canonical,0x1000);
                  }
                  sVar5 = sVar5 + 1;
                  canonical = canonical + 1;
                } while (sVar3 != sVar5);
                pcVar4 = value_to_string(v);
                iVar1 = loader_load_from_file(pcVar4,paths,sVar3,handle);
                if (iVar1 != 0) {
                  log_write_impl_va("metacall",0x207,"loader_load_from_configuration",
                                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                                    ,LOG_LEVEL_ERROR,
                                    "Loader load from configuration invalid load from file");
                  configuration_clear(config);
                  free(paths);
                  return 1;
                }
                configuration_clear(config);
                free(paths);
                return 0;
              }
              pcVar4 = "Loader load from configuration invalid paths allocation";
              sVar3 = 0x1cd;
            }
          }
        }
        log_write_impl_va("metacall",sVar3,"loader_load_from_configuration",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                          ,LOG_LEVEL_ERROR,pcVar4);
        configuration_clear(config);
        return 1;
      }
      pcVar4 = "Loader load from configuration invalid initialization (%s)";
      sVar3 = 0x1a3;
    }
    log_write_impl_va("metacall",sVar3,"loader_load_from_configuration",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                      ,LOG_LEVEL_ERROR,pcVar4,path);
  }
  return 1;
}

Assistant:

int loader_load_from_configuration(const loader_path path, void **handle, void *allocator)
{
	loader_name config_name;
	configuration config;
	value tag, scripts, context_path;
	value *scripts_array;
	loader_path *paths;
	loader_path context_path_str;
	size_t context_path_size = 0;
	size_t iterator, size;

	if (loader_initialize() == 1)
	{
		return 1;
	}

	if (portability_path_get_name(path, strnlen(path, LOADER_PATH_SIZE) + 1, config_name, LOADER_NAME_SIZE) == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid config name (%s)", path);

		return 1;
	}

	config = configuration_create(config_name, path, NULL, allocator);

	if (config == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid initialization (%s)", path);

		return 1;
	}

	tag = configuration_value_type(config, "language_id", TYPE_STRING);

	if (tag == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid tag (%s)", path);

		configuration_clear(config);

		return 1;
	}

	scripts = configuration_value_type(config, "scripts", TYPE_ARRAY);

	if (scripts == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid scripts (%s)", path);

		configuration_clear(config);

		return 1;
	}

	size = value_type_count(scripts);

	if (size == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration cannot load zero scripts");

		configuration_clear(config);

		return 1;
	}

	paths = malloc(sizeof(loader_path) * size);

	if (paths == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid paths allocation");

		configuration_clear(config);

		return 1;
	}

	context_path = configuration_value_type(config, "path", TYPE_STRING);

	if (context_path != NULL)
	{
		const char *str = value_to_string(context_path);

		size_t str_size = value_type_size(context_path);

		if (portability_path_is_absolute(str, str_size) == 0)
		{
			context_path_size = portability_path_canonical(str, str_size, context_path_str, LOADER_PATH_SIZE);
		}
		else
		{
			loader_path path_base, join_path;

			size_t path_base_size = portability_path_get_directory(path, strnlen(path, LOADER_PATH_SIZE) + 1, path_base, LOADER_PATH_SIZE);

			size_t join_path_size = portability_path_join(path_base, path_base_size, str, str_size, join_path, LOADER_PATH_SIZE);

			context_path_size = portability_path_canonical(join_path, join_path_size, context_path_str, LOADER_PATH_SIZE);
		}
	}

	scripts_array = value_to_array(scripts);

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (scripts_array[iterator] != NULL)
		{
			const char *str = value_to_string(scripts_array[iterator]);

			size_t str_size = value_type_size(scripts_array[iterator]);

			if (context_path == NULL)
			{
				(void)portability_path_canonical(str, str_size, paths[iterator], LOADER_PATH_SIZE);
			}
			else
			{
				loader_path join_path;

				size_t join_path_size = portability_path_join(context_path_str, context_path_size, str, str_size, join_path, LOADER_PATH_SIZE);

				(void)portability_path_canonical(join_path, join_path_size, paths[iterator], LOADER_PATH_SIZE);
			}
		}
	}

	if (loader_load_from_file((const char *)value_to_string(tag), (const loader_path *)paths, size, handle) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid load from file");

		configuration_clear(config);

		free(paths);

		return 1;
	}

	configuration_clear(config);

	free(paths);

	return 0;
}